

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_setup_skip_mode_allowed(AV1_COMMON *cm)

{
  uint uVar1;
  SequenceHeader *pSVar2;
  int iVar3;
  RefCntBuffer *pRVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  pSVar2 = cm->seq_params;
  (cm->current_frame).skip_mode_info.skip_mode_allowed = 0;
  (cm->current_frame).skip_mode_info.ref_frame_idx_0 = -1;
  (cm->current_frame).skip_mode_info.ref_frame_idx_1 = -1;
  if ((pSVar2->order_hint_info).enable_order_hint == 0) {
    return;
  }
  if (((cm->current_frame).frame_type & 0xfd) == 0) {
    return;
  }
  if ((cm->current_frame).reference_mode == '\0') {
    return;
  }
  uVar8 = 0xffffffff;
  uVar12 = 0x7fffffff;
  uVar11 = 0;
  uVar10 = 0xffffffff;
  uVar6 = 0xffffffff;
  do {
    if ((long)cm->remapped_ref_idx[uVar11] == -1) {
      pRVar4 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar4 = cm->ref_frame_map[cm->remapped_ref_idx[uVar11]];
    }
    if (pRVar4 != (RefCntBuffer *)0x0) {
      uVar1 = pRVar4->order_hint;
      uVar7 = uVar1 - (cm->current_frame).order_hint;
      uVar13 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      if ((int)(uVar13 - 1 & uVar7) < (int)(uVar13 & uVar7)) {
        if ((uVar8 == 0xffffffff) ||
           (uVar7 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f),
           (int)(uVar7 & uVar1 - uVar8) < (int)(uVar7 - 1 & uVar1 - uVar8))) {
          uVar6 = uVar11 & 0xffffffff;
          uVar8 = uVar1;
        }
      }
      else {
        uVar13 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f);
        if (((int)(uVar13 & uVar7) < (int)(uVar13 - 1 & uVar7)) &&
           ((uVar12 == 0x7fffffff ||
            (uVar7 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f),
            (int)(uVar7 - 1 & uVar1 - uVar12) < (int)(uVar7 & uVar1 - uVar12))))) {
          uVar10 = uVar11 & 0xffffffff;
          uVar12 = uVar1;
        }
      }
    }
    iVar9 = (int)uVar10;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 7);
  iVar5 = (int)uVar6;
  if (iVar5 == -1 || iVar9 == -1) {
    if (iVar9 != -1 || iVar5 == -1) {
      return;
    }
    uVar12 = 0xffffffff;
    uVar10 = 0;
    uVar6 = 0xffffffff;
    do {
      if ((long)cm->remapped_ref_idx[uVar10] == -1) {
        pRVar4 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar4 = cm->ref_frame_map[cm->remapped_ref_idx[uVar10]];
      }
      if ((((pRVar4 != (RefCntBuffer *)0x0) && (uVar8 != 0xffffffff)) &&
          (uVar1 = pRVar4->order_hint,
          uVar7 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f),
          (int)(uVar7 - 1 & uVar1 - uVar8) < (int)(uVar7 & uVar1 - uVar8))) &&
         ((uVar12 == 0xffffffff ||
          (uVar7 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f),
          (int)(uVar7 & uVar1 - uVar12) < (int)(uVar7 - 1 & uVar1 - uVar12))))) {
        uVar6 = uVar10 & 0xffffffff;
        uVar12 = uVar1;
      }
      iVar9 = (int)uVar6;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 7);
    if (uVar12 == 0xffffffff) {
      return;
    }
  }
  (cm->current_frame).skip_mode_info.skip_mode_allowed = 1;
  iVar3 = iVar9;
  if (iVar5 < iVar9) {
    iVar3 = iVar5;
  }
  (cm->current_frame).skip_mode_info.ref_frame_idx_0 = iVar3;
  if (iVar9 < iVar5) {
    iVar9 = iVar5;
  }
  (cm->current_frame).skip_mode_info.ref_frame_idx_1 = iVar9;
  return;
}

Assistant:

void av1_setup_skip_mode_allowed(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;
  SkipModeInfo *const skip_mode_info = &cm->current_frame.skip_mode_info;

  skip_mode_info->skip_mode_allowed = 0;
  skip_mode_info->ref_frame_idx_0 = INVALID_IDX;
  skip_mode_info->ref_frame_idx_1 = INVALID_IDX;

  if (!order_hint_info->enable_order_hint || frame_is_intra_only(cm) ||
      cm->current_frame.reference_mode == SINGLE_REFERENCE)
    return;

  const int cur_order_hint = cm->current_frame.order_hint;
  int ref_order_hints[2] = { -1, INT_MAX };
  int ref_idx[2] = { INVALID_IDX, INVALID_IDX };

  // Identify the nearest forward and backward references.
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, LAST_FRAME + i);
    if (buf == NULL) continue;

    const int ref_order_hint = buf->order_hint;
    if (get_relative_dist(order_hint_info, ref_order_hint, cur_order_hint) <
        0) {
      // Forward reference
      if (ref_order_hints[0] == -1 ||
          get_relative_dist(order_hint_info, ref_order_hint,
                            ref_order_hints[0]) > 0) {
        ref_order_hints[0] = ref_order_hint;
        ref_idx[0] = i;
      }
    } else if (get_relative_dist(order_hint_info, ref_order_hint,
                                 cur_order_hint) > 0) {
      // Backward reference
      if (ref_order_hints[1] == INT_MAX ||
          get_relative_dist(order_hint_info, ref_order_hint,
                            ref_order_hints[1]) < 0) {
        ref_order_hints[1] = ref_order_hint;
        ref_idx[1] = i;
      }
    }
  }

  if (ref_idx[0] != INVALID_IDX && ref_idx[1] != INVALID_IDX) {
    // == Bi-directional prediction ==
    skip_mode_info->skip_mode_allowed = 1;
    skip_mode_info->ref_frame_idx_0 = AOMMIN(ref_idx[0], ref_idx[1]);
    skip_mode_info->ref_frame_idx_1 = AOMMAX(ref_idx[0], ref_idx[1]);
  } else if (ref_idx[0] != INVALID_IDX && ref_idx[1] == INVALID_IDX) {
    // == Forward prediction only ==
    // Identify the second nearest forward reference.
    ref_order_hints[1] = -1;
    for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
      const RefCntBuffer *const buf = get_ref_frame_buf(cm, LAST_FRAME + i);
      if (buf == NULL) continue;

      const int ref_order_hint = buf->order_hint;
      if ((ref_order_hints[0] != -1 &&
           get_relative_dist(order_hint_info, ref_order_hint,
                             ref_order_hints[0]) < 0) &&
          (ref_order_hints[1] == -1 ||
           get_relative_dist(order_hint_info, ref_order_hint,
                             ref_order_hints[1]) > 0)) {
        // Second closest forward reference
        ref_order_hints[1] = ref_order_hint;
        ref_idx[1] = i;
      }
    }
    if (ref_order_hints[1] != -1) {
      skip_mode_info->skip_mode_allowed = 1;
      skip_mode_info->ref_frame_idx_0 = AOMMIN(ref_idx[0], ref_idx[1]);
      skip_mode_info->ref_frame_idx_1 = AOMMAX(ref_idx[0], ref_idx[1]);
    }
  }
}